

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PostfixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  ulong uVar1;
  bool bVar2;
  ExpressionSyntax *syntax_00;
  Expression *pEVar3;
  Type *args_1;
  UnaryExpression *expr;
  SourceLocation SVar4;
  Diagnostic *diag;
  SourceRange sourceRange;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  UnaryOperator local_44;
  SourceRange local_40;
  
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->operand);
  pEVar3 = Expression::create(compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x400000,
                              (Type *)0x0);
  args_1 = not_null<const_slang::ast::Type_*>::get(&pEVar3->type);
  local_44 = Expression::getUnaryOperator((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_44,args_1,pEVar3,&local_40);
  bVar2 = Expression::bad(pEVar3);
  if (!bVar2) {
    SVar4 = parsing::Token::location(&syntax->operatorToken);
    bVar2 = Expression::requireLValue
                      (pEVar3,context,SVar4,(bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0,
                       (EvalContext *)0x0);
    if (bVar2) {
      uVar1 = (context->flags).m_bits;
      if (((uint)uVar1 & 0xa0) == 0x80 || (uVar1 & 0x40) != 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x500007,sourceRange);
      }
      else {
        bVar2 = Type::isNumeric(args_1);
        if (bVar2) {
          syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                                ((SyntaxList *)&syntax->attributes);
          ASTContext::setAttributes(context,&expr->super_Expression,syntax_01);
          return &expr->super_Expression;
        }
        SVar4 = parsing::Token::location(&syntax->operatorToken);
        diag = ASTContext::addDiag(context,(DiagCode)0x310007,SVar4);
        ast::operator<<(diag,args_1);
        Diagnostic::operator<<(diag,pEVar3->sourceRange);
      }
    }
  }
  pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PostfixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    // This method is only ever called for postincrement and postdecrement operators, so
    // the operand must be an lvalue.
    Expression& operand = create(compilation, *syntax.operand, context, ASTFlags::LValue);
    const Type* type = operand.type;

    Expression* result = compilation.emplace<UnaryExpression>(getUnaryOperator(syntax.kind), *type,
                                                              operand, syntax.sourceRange());
    if (operand.bad() || !operand.requireLValue(context, syntax.operatorToken.location()))
        return badExpr(compilation, result);

    if ((context.flags.has(ASTFlags::NonProcedural) &&
         !context.flags.has(ASTFlags::AssignmentAllowed)) ||
        context.flags.has(ASTFlags::AssignmentDisallowed)) {
        context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
        return badExpr(compilation, result);
    }

    if (!type->isNumeric()) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}